

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O3

void __thiscall
OpenMD::ZConstraintForceModifier::ZConstraintForceModifier
          (ZConstraintForceModifier *this,SimInfo *info)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  int index;
  Globals *pGVar3;
  Snapshot *this_00;
  SimInfo *pSVar4;
  pointer pcVar5;
  pointer ppZVar6;
  pointer ppZVar7;
  RealType RVar8;
  undefined1 uVar9;
  long *plVar10;
  long lVar11;
  ZConsWriter *this_01;
  double *pdVar12;
  double *pdVar13;
  ulong uVar14;
  uint uVar15;
  pointer ppMVar16;
  bool bVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> stamp;
  Mat3x3d hmat;
  allocator<char> local_e9;
  double local_e8;
  string local_e0;
  string local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  string *local_98;
  _Rb_tree<int,std::pair<int_const,OpenMD::ZconstraintParam>,std::_Select1st<std::pair<int_const,OpenMD::ZconstraintParam>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZconstraintParam>>>
  *local_90;
  list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *local_88;
  double *local_80;
  Mat3x3d local_78;
  
  (this->super_ForceModifier).info_ = info;
  (this->super_ForceModifier)._vptr_ForceModifier =
       (_func_int **)&PTR__ZConstraintForceModifier_003033e8;
  local_88 = &this->movingZMols_;
  (this->movingZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)local_88;
  (this->movingZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)local_88;
  (this->movingZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  _M_size = 0;
  (this->fixedZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->fixedZMols_;
  (this->fixedZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->fixedZMols_;
  local_98 = (string *)&this->zconsOutput_;
  local_a0 = &(this->zconsOutput_).field_2;
  (this->fixedZMols_).
  super__List_base<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>._M_impl._M_node.
  _M_size = 0;
  (this->unzconsMols_).super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->unzconsMols_).super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->unzconsMols_).super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->zconsOutput_)._M_dataplus._M_p = (pointer)local_a0;
  (this->zconsOutput_)._M_string_length = 0;
  (this->zconsOutput_).field_2._M_local_buf[0] = '\0';
  local_90 = (_Rb_tree<int,std::pair<int_const,OpenMD::ZconstraintParam>,std::_Select1st<std::pair<int_const,OpenMD::ZconstraintParam>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZconstraintParam>>>
              *)&this->allZMolIndices_;
  p_Var1 = &(this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header;
  (this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->infiniteTime = 1e+31;
  pGVar3 = info->simParams_;
  this_00 = info->sman_->currentSnapshot_;
  this->currSnapshot_ = this_00;
  RVar8 = Snapshot::getTime(this_00);
  this->currZconsTime_ = RVar8;
  if ((pGVar3->Dt).super_ParameterBase.empty_ == false) {
    this->dt_ = (pGVar3->Dt).data_;
  }
  else {
    builtin_strncpy(painCave.errMsg + 0x20,"t is not set\n",0xe);
    builtin_strncpy(painCave.errMsg + 0x10,"Manager Error: d",0x10);
    builtin_strncpy(painCave.errMsg,"ZconstraintForce",0x10);
    painCave.isFatal = 1;
    simError();
  }
  if ((pGVar3->ZconsTime).super_ParameterBase.empty_ == false) {
    this->zconsTime_ = (pGVar3->ZconsTime).data_;
  }
  else {
    memcpy(&painCave,
           "ZconstraintForceManager error: If you use a ZConstraint,\n\tyou must set zconsTime.\n",
           0x53);
    painCave.isFatal = 1;
    simError();
  }
  if ((pGVar3->ZconsTol).super_ParameterBase.empty_ == false) {
    this->zconsTol_ = (pGVar3->ZconsTol).data_;
  }
  else {
    this->zconsTol_ = 0.01;
    snprintf(painCave.errMsg,2000,
             "ZconstraintForceManager Warning: Tolerance for z-constraint method is not specified.\n\tOpenMD will use a default value of %f.\n\tTo set the tolerance, use the zconsTol variable.\n"
             ,0x47ae147b);
    painCave.isFatal = 0;
    simError();
  }
  bVar17 = (pGVar3->ZconsGap).super_ParameterBase.empty_ == false;
  if (bVar17) {
    dVar2 = (pGVar3->ZconsGap).data_;
    uVar18 = SUB84(dVar2,0);
    uVar19 = (undefined4)((ulong)dVar2 >> 0x20);
  }
  else {
    uVar18 = 0;
    uVar19 = 0;
  }
  this->usingZconsGap_ = bVar17;
  this->zconsGap_ = (RealType)CONCAT44(uVar19,uVar18);
  pdVar12 = &(pGVar3->ZconsFixtime).data_;
  if ((pGVar3->ZconsFixtime).super_ParameterBase.empty_ != false) {
    pdVar12 = &this->infiniteTime;
  }
  this->zconsFixingTime_ = *pdVar12;
  if ((pGVar3->ZconsUsingSMD).super_ParameterBase.empty_ == false) {
    uVar9 = (pGVar3->ZconsUsingSMD).super_ParameterBase.field_0x2b;
  }
  else {
    uVar9 = false;
  }
  this->usingSMD_ = (bool)uVar9;
  pSVar4 = (this->super_ForceModifier).info_;
  pcVar5 = (pSVar4->finalConfigFileName_)._M_dataplus._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar5,pcVar5 + (pSVar4->finalConfigFileName_)._M_string_length);
  getPrefix(&local_e0,&local_c0);
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_e0);
  pdVar12 = local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] + 2;
  pdVar13 = (double *)(plVar10 + 2);
  if ((double *)*plVar10 == pdVar13) {
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = *pdVar13;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] =
         (double)plVar10[3];
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)pdVar12;
  }
  else {
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = *pdVar13;
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)*plVar10;
  }
  local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] =
       (double)plVar10[1];
  *plVar10 = (long)pdVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::string::operator=(local_98,(string *)&local_78);
  if ((double *)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]
      != pdVar12) {
    operator_delete((void *)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                            data_[0][0],
                    (long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                          data_[0][2] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(int)local_e0._M_dataplus._M_p) !=
      &local_e0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_e0._M_dataplus._M_p._4_4_,(int)local_e0._M_dataplus._M_p),
                    local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  Snapshot::getHmat(&local_78,this->currSnapshot_);
  if (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] <=
      local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]) {
    local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
         local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  }
  if ((pGVar3->TargetTemp).super_ParameterBase.empty_ == false) {
    local_e8 = (pGVar3->TargetTemp).data_ * 0.0019872156;
  }
  else {
    local_e8 = 0.5921902487999999;
  }
  local_80 = (double *)
             local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
  if (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] <=
      local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0]) {
    local_80 = (double *)
               local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  }
  ppZVar6 = (pGVar3->zconstraints_).
            super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppZVar7 = (pGVar3->zconstraints_).
            super__Vector_base<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_>::vector
            ((vector<OpenMD::ZConsStamp_*,_std::allocator<OpenMD::ZConsStamp_*>_> *)&local_c0,
             &pGVar3->zconstraints_);
  uVar15 = (uint)((ulong)((long)ppZVar6 - (long)ppZVar7) >> 3);
  if (0 < (int)uVar15) {
    local_e8 = local_e8 / ((double)local_80 * 0.5 * (double)local_80 * 0.5);
    uVar14 = 0;
    do {
      lVar11 = *(long *)(local_c0._M_dataplus._M_p + uVar14 * 8);
      index = *(int *)(lVar11 + 0x94);
      if (*(char *)(lVar11 + 0xc2) == '\0') {
        uVar18 = (undefined4)*(undefined8 *)(lVar11 + 200);
        uVar19 = (undefined4)((ulong)*(undefined8 *)(lVar11 + 200) >> 0x20);
      }
      else {
        RVar8 = getZTargetPos(this,index);
        uVar18 = SUB84(RVar8,0);
        uVar19 = (undefined4)((ulong)RVar8 >> 0x20);
        lVar11 = *(long *)(local_c0._M_dataplus._M_p + uVar14 * 8);
      }
      local_e0.field_2._8_8_ = 0;
      if (*(char *)(lVar11 + 0x132) == '\0') {
        local_e0.field_2._8_8_ = *(undefined8 *)(lVar11 + 0x138);
      }
      local_e0.field_2._M_allocated_capacity = (size_type)(*(double *)(lVar11 + 0x100) * local_e8);
      local_e0._M_string_length = CONCAT44(uVar19,uVar18);
      local_e0._M_dataplus._M_p._0_4_ = index;
      std::
      _Rb_tree<int,std::pair<int_const,OpenMD::ZconstraintParam>,std::_Select1st<std::pair<int_const,OpenMD::ZconstraintParam>>,std::less<int>,std::allocator<std::pair<int_const,OpenMD::ZconstraintParam>>>
      ::_M_emplace_unique<std::pair<int,OpenMD::ZconstraintParam>>
                (local_90,(pair<int,_OpenMD::ZconstraintParam> *)&local_e0);
      uVar14 = uVar14 + 1;
    } while ((uVar15 & 0x7fffffff) != uVar14);
  }
  update(this);
  this->totMassUnconsMols_ = 0.0;
  for (ppMVar16 = (this->unzconsMols_).
                  super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      ppMVar16 !=
      (this->unzconsMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppMVar16 = ppMVar16 + 1) {
    RVar8 = Molecule::getMass(*ppMVar16);
    this->totMassUnconsMols_ = RVar8 + this->totMassUnconsMols_;
  }
  zeroVelocity(this);
  this_01 = (ZConsWriter *)operator_new(0x208);
  pSVar4 = (this->super_ForceModifier).info_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,(this->zconsOutput_)._M_dataplus._M_p,&local_e9);
  ZConsWriter::ZConsWriter(this_01,pSVar4,&local_e0);
  this->fzOut = this_01;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_e0._M_dataplus._M_p._4_4_,(int)local_e0._M_dataplus._M_p) !=
      &local_e0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_e0._M_dataplus._M_p._4_4_,(int)local_e0._M_dataplus._M_p),
                    local_e0.field_2._M_allocated_capacity + 1);
    if (this->fzOut == (ZConsWriter *)0x0) {
      builtin_strncpy(painCave.errMsg,"ZconstraintForceManager:: Failed to create ZConsWriter\n",
                      0x38);
      painCave.isFatal = 1;
      simError();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_c0._M_dataplus._M_p,
                    local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
  }
  return;
}

Assistant:

ZConstraintForceModifier::ZConstraintForceModifier(SimInfo* info) :
      ForceModifier {info}, infiniteTime {1e31} {
    Globals* simParam = info_->getSimParams();
    currSnapshot_     = info_->getSnapshotManager()->getCurrentSnapshot();
    currZconsTime_    = currSnapshot_->getTime();

    if (simParam->haveDt()) {
      dt_ = simParam->getDt();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParam->haveZconsTime()) {
      zconsTime_ = simParam->getZconsTime();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager error: If you use a ZConstraint,\n"
               "\tyou must set zconsTime.\n");
      painCave.isFatal = 1;
      simError();
    }

    if (simParam->haveZconsTol()) {
      zconsTol_ = simParam->getZconsTol();
    } else {
      zconsTol_ = 0.01;
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager Warning: Tolerance for z-constraint "
               "method is not specified.\n"
               "\tOpenMD will use a default value of %f.\n"
               "\tTo set the tolerance, use the zconsTol variable.\n",
               zconsTol_);
      painCave.isFatal = 0;
      simError();
    }

    // set zcons gap
    if (simParam->haveZconsGap()) {
      usingZconsGap_ = true;
      zconsGap_      = simParam->getZconsGap();
    } else {
      usingZconsGap_ = false;
      zconsGap_      = 0.0;
    }

    // set zcons fixtime
    if (simParam->haveZconsFixtime()) {
      zconsFixingTime_ = simParam->getZconsFixtime();
    } else {
      zconsFixingTime_ = infiniteTime;
    }

    // set zconsUsingSMD
    if (simParam->haveZconsUsingSMD()) {
      usingSMD_ = simParam->getZconsUsingSMD();
    } else {
      usingSMD_ = false;
    }

    zconsOutput_ = getPrefix(info_->getFinalConfigFileName()) + ".fz";

    // estimate the force constant of harmonical potential
    Mat3x3d hmat = currSnapshot_->getHmat();
    RealType halfOfLargestBox =
        std::max(hmat(0, 0), std::max(hmat(1, 1), hmat(2, 2))) / 2;
    RealType targetTemp;
    if (simParam->haveTargetTemp()) {
      targetTemp = simParam->getTargetTemp();
    } else {
      targetTemp = 298.0;
    }
    RealType zforceConstant =
        Constants::kb * targetTemp / (halfOfLargestBox * halfOfLargestBox);

    int nZconstraints              = simParam->getNZconsStamps();
    std::vector<ZConsStamp*> stamp = simParam->getZconsStamps();

    for (int i = 0; i < nZconstraints; i++) {
      ZconstraintParam param;
      int zmolIndex = stamp[i]->getMolIndex();
      if (stamp[i]->haveZpos()) {
        param.zTargetPos = stamp[i]->getZpos();
      } else {
        param.zTargetPos = getZTargetPos(zmolIndex);
      }

      param.kz = zforceConstant * stamp[i]->getKratio();

      if (stamp[i]->haveCantVel()) {
        param.cantVel = stamp[i]->getCantVel();
      } else {
        param.cantVel = 0.0;
      }

      allZMolIndices_.insert(std::make_pair(zmolIndex, param));
    }

    // create fixedMols_, movingMols_ and unconsMols lists
    update();

    // calculate mass of unconstrained molecules in the whole system
    // (never changes during the simulation)

    totMassUnconsMols_ = 0.0;
    std::vector<Molecule*>::iterator j;
    for (j = unzconsMols_.begin(); j != unzconsMols_.end(); ++j) {
      totMassUnconsMols_ += (*j)->getMass();
    }
#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &totMassUnconsMols_, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    // Zero out the velocities of center of mass of unconstrained
    // molecules and the velocities of center of mass of every single
    // z-constrained molecueles
    zeroVelocity();

    // create zconsWriter
    fzOut = new ZConsWriter(info_, zconsOutput_.c_str());

    if (!fzOut) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ZconstraintForceManager:: Failed to create ZConsWriter\n");
      painCave.isFatal = 1;
      simError();
    }
  }